

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option-parser.cc
# Opt level: O2

void __thiscall wabt::OptionParser::Errorf(OptionParser *this,char *format,...)

{
  long lVar1;
  int iVar2;
  char *__s;
  size_t __maxlen;
  undefined8 uStack_1b0;
  char local_1a8 [8];
  char fixed_buf [128];
  char *local_78;
  string msg;
  va_list args;
  undefined8 local_38;
  va_list args_copy;
  
  __s = local_1a8;
  args_copy[0].overflow_arg_area = fixed_buf + 0x78;
  msg.field_2._8_8_ = 0x3000000010;
  args_copy[0]._0_8_ = &stack0x00000008;
  local_38 = 0x3000000010;
  uStack_1b0 = 0x12076f;
  iVar2 = vsnprintf(local_1a8,0x80,format,(__gnuc_va_list)((long)&msg.field_2 + 8));
  __maxlen = (long)iVar2 + 1;
  if (0x80 < __maxlen) {
    lVar1 = -((long)iVar2 + 0x10U & 0xfffffffffffffff0);
    __s = local_1a8 + lVar1;
    *(undefined8 *)((long)&uStack_1b0 + lVar1) = 0x12079e;
    vsnprintf(__s,__maxlen,format,&local_38);
  }
  __s[-8] = -0x53;
  __s[-7] = '\a';
  __s[-6] = '\x12';
  __s[-5] = '\0';
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  std::__cxx11::string::string((string *)&local_78,(string *)this);
  __s[-8] = -0x44;
  __s[-7] = '\a';
  __s[-6] = '\x12';
  __s[-5] = '\0';
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  std::__cxx11::string::append((char *)&local_78);
  __s[-8] = -0x39;
  __s[-7] = '\a';
  __s[-6] = '\x12';
  __s[-5] = '\0';
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  std::__cxx11::string::append((char *)&local_78);
  __s[-8] = -0x2a;
  __s[-7] = '\a';
  __s[-6] = '\x12';
  __s[-5] = '\0';
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  std::__cxx11::string::append((char *)&local_78);
  __s[-8] = -0x1b;
  __s[-7] = '\a';
  __s[-6] = '\x12';
  __s[-5] = '\0';
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  std::function<void_(const_char_*)>::operator()(&this->on_error_,local_78);
  __s[-8] = -0x13;
  __s[-7] = '\a';
  __s[-6] = '\x12';
  __s[-5] = '\0';
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void OptionParser::Errorf(const char* format, ...) {
  WABT_SNPRINTF_ALLOCA(buffer, length, format);
  std::string msg(program_name_);
  msg += ": ";
  msg += buffer;
  msg += "\nTry '--help' for more information.";
  on_error_(msg.c_str());
}